

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_aec.c
# Opt level: O3

int encode_decode_small(test_state *state)

{
  aec_stream_conflict *strm;
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *__s;
  int i;
  size_t sVar5;
  ulong uVar6;
  int i_1;
  ulong uVar7;
  
  strm = (aec_stream_conflict *)state->strm;
  iVar4 = aec_encode_init((aec_stream *)strm);
  if (iVar4 == 0) {
    strm->next_in = state->ubuf;
    strm->avail_in = (long)state->bytes_per_sample;
    strm->avail_out = 1;
    strm->next_out = state->cbuf;
    bVar2 = true;
    sVar5 = 0;
    uVar7 = 0;
    do {
      if (state->cbuf_len <= sVar5) break;
      if (!(bool)(~bVar2 & 1U | strm->avail_in != 0)) {
        uVar7 = uVar7 + (long)state->bytes_per_sample;
        if (uVar7 < state->buf_len) {
          strm->avail_in = (long)state->bytes_per_sample;
          strm->next_in = state->ubuf + uVar7;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
      iVar4 = aec_encode((aec_stream *)strm,0);
      if (iVar4 != 0) goto LAB_00105d69;
      sVar1 = strm->total_out;
      if ((sVar1 == sVar5) || (state->cbuf_len <= sVar5)) {
        bVar3 = false;
      }
      else {
        strm->avail_out = 1;
        strm->next_out = state->cbuf + sVar1;
        bVar3 = true;
        sVar5 = sVar1;
      }
    } while (bVar3 || bVar2);
    iVar4 = aec_encode((aec_stream *)strm,1);
    if (iVar4 != 0) {
      __s = "Encode failed.";
      goto LAB_00105b7f;
    }
    aec_encode_end((aec_stream *)strm);
    uVar7 = strm->total_out;
    strm->avail_in = 1;
    strm->next_in = state->cbuf;
    strm->avail_out = (long)state->bytes_per_sample;
    strm->next_out = state->obuf;
    iVar4 = aec_decode_init(strm);
    if (iVar4 == 0) {
      strm->next_in = state->cbuf;
      strm->avail_in = 1;
      strm->avail_out = (long)state->bytes_per_sample;
      strm->next_out = state->obuf;
      bVar2 = true;
      sVar5 = 0;
      uVar6 = 0;
      do {
        if (state->buf_len <= sVar5) break;
        if (!(bool)(~bVar2 & 1U | strm->avail_in != 0)) {
          uVar6 = uVar6 + 1;
          if (uVar6 < uVar7) {
            strm->avail_in = 1;
            strm->next_in = state->cbuf + uVar6;
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
        }
        iVar4 = aec_decode(strm,0);
        if (iVar4 != 0) goto LAB_00105d69;
        sVar1 = strm->total_out;
        if ((sVar1 == sVar5) || (state->buf_len <= sVar5)) {
          bVar3 = false;
        }
        else {
          strm->avail_out = (long)state->bytes_per_sample;
          strm->next_out = state->obuf + sVar1;
          bVar3 = true;
          sVar5 = sVar1;
        }
      } while (bVar3 || bVar2);
      iVar4 = aec_decode(strm,1);
      if (iVar4 == 0) {
        iVar4 = bcmp(state->ubuf,state->obuf,state->ibuf_len);
        if (iVar4 != 0) {
          printf("\n%s: Uncompressed output differs from input.\n","\x1b[0;31mFAIL\x1b[0m");
          printf("\nuncompressed buf");
          uVar6 = 0;
          do {
            if ((uVar6 & 7) == 0) {
              putchar(10);
            }
            printf("%02x ",(ulong)state->ubuf[uVar6]);
            uVar6 = uVar6 + 1;
          } while (uVar6 != 0x50);
          printf("\n\ncompressed buf len %zu",uVar7);
          uVar7 = 0;
          do {
            if ((uVar7 & 7) == 0) {
              putchar(10);
            }
            printf("%02x ",(ulong)state->cbuf[uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar7 != 0x50);
          printf("\n\ndecompressed buf");
          uVar7 = 0;
          do {
            if ((uVar7 & 7) == 0) {
              printf("\n%04i ",uVar7 & 0xffffffff);
            }
            printf("%02x ",(ulong)state->obuf[uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar7 != 0x50);
          putchar(10);
          return 99;
        }
        aec_decode_end(strm);
        return 0;
      }
LAB_00105d69:
      __s = "Decode failed.";
      goto LAB_00105b7f;
    }
  }
  __s = "Init failed.";
LAB_00105b7f:
  puts(__s);
  return 99;
}

Assistant:

int encode_decode_small(struct test_state *state)
{
    size_t compressed_size;
    size_t n_in, avail_in, avail_out, total_out;
    struct aec_stream *strm = state->strm;

    int status = aec_encode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    n_in = 0;
    avail_in = 1;
    avail_out = 1;
    total_out = 0;
    strm->next_in = state->ubuf;
    strm->avail_in = state->bytes_per_sample;
    strm->avail_out = 1;
    strm->next_out = state->cbuf;

    while ((avail_in || avail_out) && total_out < state->cbuf_len) {
        if (strm->avail_in == 0 && avail_in) {
            n_in += state->bytes_per_sample;
            if (n_in < state->buf_len) {
                strm->avail_in = state->bytes_per_sample;
                strm->next_in = state->ubuf + n_in;
            } else {
                avail_in = 0;
            }
        }

        status = aec_encode(strm, AEC_NO_FLUSH);
        if (status != AEC_OK) {
            printf("Decode failed.\n");
            return 99;
        }

        if (strm->total_out - total_out > 0
            && total_out < state->cbuf_len) {
            total_out = strm->total_out;
            strm->avail_out = 1;
            strm->next_out = state->cbuf + total_out;
            avail_out = 1;
        } else {
            avail_out = 0;
        }
    }

    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Encode failed.\n");
        return 99;
    }

    aec_encode_end(strm);

    compressed_size = strm->total_out;

    strm->avail_in = 1;
    strm->next_in = state->cbuf;

    strm->avail_out = state->bytes_per_sample;
    strm->next_out = state->obuf;

    status = aec_decode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    n_in = 0;
    avail_in = 1;
    avail_out = 1;
    total_out = 0;
    strm->next_in = state->cbuf;
    strm->avail_in = 1;
    strm->avail_out = state->bytes_per_sample;
    strm->next_out = state->obuf;

    while ((avail_in || avail_out) && total_out < state->buf_len) {
        if (strm->avail_in == 0 && avail_in) {
            n_in++;
            if (n_in < compressed_size) {
                strm->avail_in = 1;
                strm->next_in = state->cbuf + n_in;
            } else {
                avail_in = 0;
            }
        }

        status = aec_decode(strm, AEC_NO_FLUSH);
        if (status != AEC_OK) {
            printf("Decode failed.\n");
            return 99;
        }

        if (strm->total_out - total_out > 0
            && total_out < state->buf_len) {
            total_out = strm->total_out;
            strm->avail_out = state->bytes_per_sample;
            strm->next_out = state->obuf + total_out;
            avail_out = 1;
        } else {
            avail_out = 0;
        }
    }

    status = aec_decode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Decode failed.\n");
        return 99;
    }

    if (memcmp(state->ubuf, state->obuf, state->ibuf_len)) {
        printf("\n%s: Uncompressed output differs from input.\n", CHECK_FAIL);

        printf("\nuncompressed buf");
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->ubuf[i]);
        }
        printf("\n\ncompressed buf len %zu", compressed_size);
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->cbuf[i]);
        }
        printf("\n\ndecompressed buf");
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n%04i ", i);
            printf("%02x ", state->obuf[i]);
        }
        printf("\n");
        return 99;
    }
    aec_decode_end(strm);
    return 0;
}